

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmGeneratorTarget::GetTargetVersion(cmGeneratorTarget *this,int *major,int *minor)

{
  allocator<char> local_49;
  string local_48;
  int local_24;
  int *piStack_20;
  int patch;
  int *minor_local;
  int *major_local;
  cmGeneratorTarget *this_local;
  
  piStack_20 = minor;
  minor_local = major;
  major_local = (int *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,"VERSION",&local_49);
  GetTargetVersion(this,&local_48,minor_local,piStack_20,&local_24);
  std::__cxx11::string::~string((string *)&local_48);
  std::allocator<char>::~allocator(&local_49);
  return;
}

Assistant:

void cmGeneratorTarget::GetTargetVersion(int& major, int& minor) const
{
  int patch;
  this->GetTargetVersion("VERSION", major, minor, patch);
}